

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

QColor __thiscall QColorDialogPrivate::grabScreenColor(QColorDialogPrivate *this,QPoint *p)

{
  QColor QVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QColor local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = QGuiApplication::screenAt(p);
  if (lVar3 == 0) {
    lVar3 = QGuiApplication::primaryScreen();
  }
  uVar4 = QScreen::geometry();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QScreen::grabWindow((ulonglong)&local_58,(int)lVar3,0,(p->xp).m_i - (int)uVar4,
                      (p->yp).m_i - (int)((ulong)uVar4 >> 0x20));
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage();
  uVar2 = QImage::pixel((int)(QImage *)&local_78,0);
  QColor::QColor(&local_38,uVar2);
  QImage::~QImage((QImage *)&local_78);
  QPixmap::~QPixmap((QPixmap *)&local_58);
  QVar1._8_8_ = local_38._8_8_;
  QVar1._0_8_ = local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QColor QColorDialogPrivate::grabScreenColor(const QPoint &p)
{
    QScreen *screen = QGuiApplication::screenAt(p);
    if (!screen)
        screen = QGuiApplication::primaryScreen();
    const QRect screenRect = screen->geometry();
    const QPixmap pixmap =
            screen->grabWindow(0, p.x() - screenRect.x(), p.y() - screenRect.y(), 1, 1);
    const QImage i = pixmap.toImage();
    return i.pixel(0, 0);
}